

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O2

void Str_NtkBalanceMulti(Gia_Man_t *pNew,Str_Ntk_t *p,Str_Obj_t *pObj,Vec_Int_t *vDelay,int nLutSize
                        )

{
  uint uVar1;
  Str_Ntk_t *p_00;
  Vec_Int_t *p_01;
  Str_Obj_t *pSuper;
  uint *pCost;
  word wVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  Vec_Int_t *extraout_RDX;
  Vec_Int_t *vDelay_00;
  Vec_Int_t *extraout_RDX_00;
  ulong uVar8;
  int iVar9;
  Str_Ntk_t *pSVar10;
  ulong uVar11;
  Vec_Int_t *pVVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  undefined8 uVar18;
  uint local_89c;
  ulong local_890;
  int local_874;
  int local_870;
  int local_86c;
  word pMatrix [256];
  
  p_00 = (Str_Ntk_t *)pNew->vSuper;
  if (p_00->nObjs < 0x100) {
    __assert_fail("Limit <= Vec_IntCap(vSuper)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaStr.c"
                  ,0x449,
                  "void Str_NtkBalanceMulti(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, Vec_Int_t *, int)"
                 );
  }
  p_01 = pNew->vStore;
  if (p_01->nCap < 0x100) {
    __assert_fail("Limit <= Vec_IntCap(vCosts)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaStr.c"
                  ,0x44a,
                  "void Str_NtkBalanceMulti(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, Vec_Int_t *, int)"
                 );
  }
  pSuper = p_00->pObjs;
  pCost = (uint *)p_01->pArray;
  p_00->nObjsAlloc = 0;
  pSVar10 = p;
  for (uVar17 = 0; uVar17 < *(uint *)pObj >> 4; uVar17 = uVar17 + 1) {
    uVar3 = Str_ObjFaninCopy(p,pObj,uVar17);
    pSVar10 = (Str_Ntk_t *)(ulong)uVar3;
    Vec_IntPush((Vec_Int_t *)p_00,uVar3);
  }
  Vec_IntSort((Vec_Int_t *)p_00,(int)pSVar10);
  if (((undefined1  [16])*pObj & (undefined1  [16])0xf) == (undefined1  [16])0x3) {
    iVar4 = 0x605c9a;
    Gia_ManSimplifyAnd((Vec_Int_t *)p_00);
  }
  else {
    iVar4 = 0x605ca1;
    Gia_ManSimplifyXor((Vec_Int_t *)p_00);
  }
  iVar5 = p_00->nObjsAlloc;
  if (iVar5 < 1) {
    __assert_fail("Vec_IntSize(vSuper) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaStr.c"
                  ,0x455,
                  "void Str_NtkBalanceMulti(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, Vec_Int_t *, int)"
                 );
  }
  if (iVar5 != 2) {
    if (iVar5 == 1) {
      iVar4 = Vec_IntEntry((Vec_Int_t *)p_00,0);
      goto LAB_0060612c;
    }
    p_01->nSize = 0;
    iVar4 = 0;
    while( true ) {
      uVar17 = p_00->nObjsAlloc;
      if ((int)uVar17 <= iVar4) break;
      iVar5 = Vec_IntEntry((Vec_Int_t *)p_00,iVar4);
      iVar5 = Abc_Lit2Var(iVar5);
      iVar5 = Vec_IntEntry(vDelay,iVar5);
      Vec_IntPush(p_01,iVar5);
      iVar4 = iVar4 + 1;
    }
    uVar3 = 1;
    if (1 < (int)uVar17) {
      uVar3 = uVar17;
    }
    uVar18 = 1;
    vDelay_00 = (Vec_Int_t *)0x1;
    for (uVar11 = 0; uVar11 != uVar3 - 1; uVar11 = uVar11 + 1) {
      uVar7 = uVar11 & 0xffffffff;
      for (pVVar12 = vDelay_00; iVar4 = (int)uVar7, (Vec_Int_t *)(ulong)uVar17 != pVVar12;
          pVVar12 = (Vec_Int_t *)((long)&pVVar12->nCap + 1)) {
        uVar15 = (ulong)pVVar12 & 0xffffffff;
        if ((int)pCost[iVar4] <= (int)pCost[(long)pVVar12]) {
          uVar15 = uVar7;
        }
        uVar7 = uVar15;
      }
      iVar5 = *(int *)((long)&pSuper->field_0x0 + uVar11 * 4);
      *(int *)((long)&pSuper->field_0x0 + uVar11 * 4) =
           *(int *)((long)&pSuper->field_0x0 + (long)iVar4 * 4);
      *(int *)((long)&pSuper->field_0x0 + (long)iVar4 * 4) = iVar5;
      uVar1 = pCost[uVar11];
      pCost[uVar11] = pCost[iVar4];
      pCost[iVar4] = uVar1;
      vDelay_00 = (Vec_Int_t *)((long)&vDelay_00->nCap + 1);
    }
    if (p_00->nObjsAlloc < 0x40) {
      uVar18 = 0x605da1;
      Str_ManVectorAffinity(pNew,(Vec_Int_t *)p_00,vDelay_00,pMatrix,0x100);
      vDelay_00 = extraout_RDX;
    }
    while( true ) {
      iVar4 = (int)uVar18;
      uVar17 = p_00->nObjsAlloc;
      local_890 = (ulong)uVar17;
      pSVar10 = p_00;
      if ((int)uVar17 < 3) break;
      if (uVar17 < 0x41) {
        if (uVar17 == 0x40) {
          uVar18 = 0x605e0e;
          Str_ManVectorAffinity(pNew,(Vec_Int_t *)p_00,vDelay_00,pMatrix,0x100);
          local_890 = (ulong)(uint)p_00->nObjsAlloc;
          if (0x40 < p_00->nObjsAlloc) {
            __assert_fail("Vec_IntSize(vSuper) <= 64",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaStr.c"
                          ,0x47e,
                          "void Str_NtkBalanceMulti(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, Vec_Int_t *, int)"
                         );
          }
        }
        wVar2 = pMatrix[0];
        uVar17 = *pCost;
        if ((uVar17 == 0x11) && (pCost[1] == 0x11)) {
          local_89c = 1;
          goto LAB_00605de3;
        }
        iVar4 = (int)local_890;
        uVar11 = 0;
        if (0 < iVar4) {
          uVar11 = local_890;
        }
        for (uVar7 = 0; uVar11 != uVar7; uVar7 = uVar7 + 1) {
          if (0xf < (pCost[uVar7] ^ uVar17)) {
            uVar11 = uVar7 & 0xffffffff;
            break;
          }
        }
        if ((int)uVar11 == 1) {
          uVar17 = Str_CountBits(pMatrix[1] & pMatrix[0]);
          uVar18 = 1;
          uVar7 = 1;
          for (uVar11 = 2; ((long)uVar11 < (long)iVar4 && ((pCost[1] ^ pCost[uVar11]) < 0x10));
              uVar11 = uVar11 + 1) {
            uVar18 = 0x605eca;
            uVar3 = Str_CountBits(pMatrix[uVar11] & wVar2);
            if (uVar17 < uVar3) {
              uVar7 = uVar11;
            }
            uVar7 = uVar7 & 0xffffffff;
            if ((int)uVar17 <= (int)uVar3) {
              uVar17 = uVar3;
            }
          }
          local_89c = (uint)uVar7;
          if (((int)local_89c < 1) || (iVar4 <= (int)local_89c)) {
            __assert_fail("iBest > 0 && iBest < Vec_IntSize(vSuper)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaStr.c"
                          ,0x49a,
                          "void Str_NtkBalanceMulti(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, Vec_Int_t *, int)"
                         );
          }
          iVar4 = 0;
        }
        else {
          uVar18 = 0xffffffffffffffff;
          iVar5 = -1;
          local_89c = 0xffffffff;
          iVar13 = -1;
          for (uVar7 = 1; uVar7 < uVar11; uVar7 = uVar7 + 1) {
            iVar9 = (pCost[uVar7] & 0xf) + (uVar17 & 0xf);
            if (iVar9 <= nLutSize) {
              uVar18 = 0x605f1c;
              iVar6 = Str_CountBits(pMatrix[uVar7] & wVar2);
              if ((iVar13 < iVar9) || ((iVar13 == iVar9 && (iVar5 < iVar6)))) {
                local_89c = (uint)uVar7;
                iVar13 = iVar9;
                iVar5 = iVar6;
              }
            }
          }
          if (iVar13 == nLutSize) {
            if (((int)local_89c < 1) || (iVar4 <= (int)local_89c)) {
              __assert_fail("iBest > 0 && iBest < Vec_IntSize(vSuper)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaStr.c"
                            ,0x4ae,
                            "void Str_NtkBalanceMulti(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, Vec_Int_t *, int)"
                           );
            }
            goto LAB_00605de3;
          }
          uVar7 = 1;
          uVar18 = 0xffffffffffffffff;
          local_89c = -1;
          uVar15 = 0xffffffff;
          uVar14 = 0xffffffff;
          local_874 = local_89c;
          local_870 = local_89c;
          local_86c = local_89c;
          for (uVar8 = 0; uVar8 != uVar11; uVar8 = uVar8 + 1) {
            uVar17 = (int)uVar8 << 0x10;
            for (uVar16 = uVar7; uVar16 < uVar11; uVar16 = uVar16 + 1) {
              iVar5 = (pCost[uVar16] & 0xf) + (pCost[uVar8] & 0xf);
              uVar18 = 0x606023;
              iVar4 = Str_CountBits(pMatrix[uVar16] & pMatrix[uVar8]);
              if (nLutSize < iVar5) {
                if ((local_86c < iVar4) || ((local_86c == iVar4 && (local_874 < iVar5)))) {
                  uVar14 = (ulong)(uVar17 | (uint)uVar16);
                  local_874 = iVar5;
                  local_86c = iVar4;
                }
              }
              else if (((int)local_89c < iVar4) || ((local_89c == iVar4 && (local_870 < iVar5)))) {
                uVar15 = (ulong)(uVar17 | (uint)uVar16);
                local_89c = iVar4;
                local_870 = iVar5;
              }
            }
            uVar7 = uVar7 + 1;
          }
          if ((int)uVar15 < 0) {
            uVar15 = uVar14;
            if ((int)uVar14 < 1) {
              __assert_fail("iBest2 > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaStr.c"
                            ,0x4cf,
                            "void Str_NtkBalanceMulti(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, Vec_Int_t *, int)"
                           );
            }
          }
          else if ((int)uVar15 == 0) {
            __assert_fail("iBest > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaStr.c"
                          ,0x4c8,
                          "void Str_NtkBalanceMulti(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, Vec_Int_t *, int)"
                         );
          }
          local_89c = (uint)uVar15 & 0xffff;
          iVar4 = (int)(uVar15 >> 0x10);
        }
      }
      else {
        local_89c = 1;
LAB_00605de3:
        iVar4 = 0;
      }
      Str_NtkBalanceTwo(pNew,pSVar10,pObj,iVar4,local_89c,vDelay,(int *)pCost,(int *)pSuper,pMatrix,
                        (int)local_890,nLutSize,(int)uVar18);
      p_00->nObjsAlloc = p_00->nObjsAlloc + -1;
      p_01->nSize = p_01->nSize + -1;
      vDelay_00 = extraout_RDX_00;
    }
  }
  iVar4 = Str_NtkBalanceTwo(pNew,pSVar10,pObj,0,1,vDelay,(int *)pCost,(int *)pSuper,pMatrix,2,
                            nLutSize,iVar4);
LAB_0060612c:
  pObj->iCopy = iVar4;
  return;
}

Assistant:

void Str_NtkBalanceMulti( Gia_Man_t * pNew, Str_Ntk_t * p, Str_Obj_t * pObj, Vec_Int_t * vDelay, int nLutSize )
{
    word pMatrix[256];
    int Limit = 256;
    Vec_Int_t * vSuper = pNew->vSuper;
    Vec_Int_t * vCosts = pNew->vStore;
    int * pSuper = Vec_IntArray(vSuper);
    int * pCost  = Vec_IntArray(vCosts);
    int k, iLit, MatrixSize = 0;
    assert( Limit <= Vec_IntCap(vSuper) );
    assert( Limit <= Vec_IntCap(vCosts) );

    // collect nodes
    Vec_IntClear( vSuper );
    for ( k = 0; k < (int)pObj->nFanins; k++ )
        Vec_IntPush( vSuper, Str_ObjFaninCopy(p, pObj, k) );
    Vec_IntSort( vSuper, 0 );
    if ( pObj->Type == STR_AND )
        Gia_ManSimplifyAnd( vSuper );
    else
        Gia_ManSimplifyXor( vSuper );
    assert( Vec_IntSize(vSuper) > 0 );
    if ( Vec_IntSize(vSuper) == 1 )
    {
        pObj->iCopy = Vec_IntEntry(vSuper, 0);
        return;
    }
    if ( Vec_IntSize(vSuper) == 2 )
    {
        pObj->iCopy = Str_NtkBalanceTwo( pNew, p, pObj, 0, 1, vDelay, pCost, pSuper, pMatrix, 2, nLutSize, -1 );
        return;
    }

    // sort by cost
    Vec_IntClear( vCosts );
    Vec_IntForEachEntry( vSuper, iLit, k )
        Vec_IntPush( vCosts, Vec_IntEntry(vDelay, Abc_Lit2Var(iLit)) );
    Vec_IntSelectSortCost2( pSuper, Vec_IntSize(vSuper), pCost );

    // compute affinity
    if ( Vec_IntSize(vSuper) < 64 )
        MatrixSize = Str_ManVectorAffinity( pNew, vSuper, vCosts, pMatrix, Limit );

    // start the new product
    while ( Vec_IntSize(vSuper) > 2 )
    {
        // pair the first entry with another one on the same level
        int i, iStop, iBest,iBest2;
        int CostNew, CostBest, CostBest2;
        int OccurNew, OccurBest, OccurBest2;

        if ( Vec_IntSize(vSuper) > 64 )
        {
            Str_NtkBalanceTwo( pNew, p, pObj, 0, 1, vDelay, pCost, pSuper, pMatrix, Vec_IntSize(vSuper), nLutSize, -1 );
            vSuper->nSize--;
            vCosts->nSize--;
            continue;
        }

        // compute affinity
        if ( Vec_IntSize(vSuper) == 64 )
            MatrixSize = Str_ManVectorAffinity( pNew, vSuper, vCosts, pMatrix, Limit );
        assert( Vec_IntSize(vSuper) <= 64 );
//        Str_PrintState( pCost, pSuper, pMatrix, Vec_IntSize(vSuper) );

        // if the first two are PIs group them
        if ( pCost[0] == 17 && pCost[1] == 17 )
        {
            Str_NtkBalanceTwo( pNew, p, pObj, 0, 1, vDelay, pCost, pSuper, pMatrix, Vec_IntSize(vSuper), nLutSize, 2 );
            vSuper->nSize--;
            vCosts->nSize--;
            continue;
        }

        // find the end of the level
        for ( iStop = 0; iStop < Vec_IntSize(vSuper); iStop++ )
            if ( (pCost[iStop] >> 4) != (pCost[0] >> 4) )
                break;
        // if there is only one this level, pair it with the best match in the next level
        if ( iStop == 1 )
        {
            iBest = iStop, OccurBest = Str_CountBits(pMatrix[0] & pMatrix[iStop]);
            for ( i = iStop + 1; i < Vec_IntSize(vSuper); i++ )
            {
                if ( (pCost[i] >> 4) != (pCost[iStop] >> 4) )
                    break;
                OccurNew = Str_CountBits(pMatrix[0] & pMatrix[i]);
                if ( OccurBest < OccurNew )
                    iBest = i, OccurBest = OccurNew;
            }
            assert( iBest > 0 && iBest < Vec_IntSize(vSuper) );
            Str_NtkBalanceTwo( pNew, p, pObj, 0, iBest, vDelay, pCost, pSuper, pMatrix, Vec_IntSize(vSuper), nLutSize, -1 );
            vSuper->nSize--;
            vCosts->nSize--;
            continue;
        }
        // pair the first entry with another one on the same level
        iBest = -1; CostBest = -1; OccurBest2 = -1; OccurBest = -1;
        for ( i = 1; i < iStop; i++ )
        {
            CostNew = (pCost[0] & 15) + (pCost[i] & 15);
            if ( CostNew > nLutSize )
                continue;
            OccurNew = Str_CountBits(pMatrix[0] & pMatrix[i]);
            if ( CostBest < CostNew || (CostBest == CostNew && OccurBest < OccurNew) )
                CostBest = CostNew, iBest = i, OccurBest = OccurNew;
        }
        // if the best found is perfect, take it
        if ( CostBest == nLutSize )
        {
            assert( iBest > 0 && iBest < Vec_IntSize(vSuper) );
            Str_NtkBalanceTwo( pNew, p, pObj, 0, iBest, vDelay, pCost, pSuper, pMatrix, Vec_IntSize(vSuper), nLutSize, CostBest );
            vSuper->nSize--;
            vCosts->nSize--;
            continue;
        }
        // find the best pair on this level
        iBest = iBest2 = -1; CostBest = CostBest2 = -1, OccurBest = OccurBest2 = -1;
        for ( i = 0; i < iStop; i++ )
        for ( k = i+1; k < iStop; k++ )
        {
            CostNew  = (pCost[i] & 15) + (pCost[k] & 15);
            OccurNew = Str_CountBits(pMatrix[i] & pMatrix[k]);
            if ( CostNew <= nLutSize ) // the same level
            {
                if ( OccurBest < OccurNew || (OccurBest == OccurNew && CostBest < CostNew ))
                    CostBest = CostNew, iBest = (i << 16) | k, OccurBest = OccurNew;
            }
            else // overflow to the next level
            {
                if ( OccurBest2 < OccurNew || (OccurBest2 == OccurNew && CostBest2 < CostNew) )
                    CostBest2 = CostNew, iBest2 = (i << 16) | k, OccurBest2 = OccurNew;
            }
        }
        if ( iBest >= 0 )
        {
            assert( iBest > 0 );
            Str_NtkBalanceTwo( pNew, p, pObj, iBest>>16, iBest&0xFFFF, vDelay, pCost, pSuper, pMatrix, Vec_IntSize(vSuper), nLutSize, CostBest );
            vSuper->nSize--;
            vCosts->nSize--;
            continue;
        }
        // take any remaining pair
        assert( iBest2 > 0 );
        Str_NtkBalanceTwo( pNew, p, pObj, iBest2>>16, iBest2&0xFFFF, vDelay, pCost, pSuper, pMatrix, Vec_IntSize(vSuper), nLutSize, -1 );
        vSuper->nSize--;
        vCosts->nSize--;
        continue;
    }
    pObj->iCopy = Str_NtkBalanceTwo( pNew, p, pObj, 0, 1, vDelay, pCost, pSuper, pMatrix, 2, nLutSize, -1 );

/*
    // simple
    pObj->iCopy = (pObj->Type == STR_AND);
    for ( k = 0; k < Vec_IntSize(vSuper); k++ )
    {
        if ( pObj->Type == STR_AND )
            pObj->iCopy = Gia_ManHashAnd( pNew, pObj->iCopy, Vec_IntEntry(vSuper, k) );
        else
            pObj->iCopy = Gia_ManHashXorReal( pNew, pObj->iCopy, Vec_IntEntry(vSuper, k) );
        Str_ObjDelay( pNew, Abc_Lit2Var(pObj->iCopy), nLutSize, vDelay );
    }
*/
}